

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  int iVar3;
  uint32 uVar4;
  uint *puVar5;
  unsigned_long *puVar6;
  int *piVar7;
  long *plVar8;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  MessageLite *pMVar10;
  int local_b0;
  int size;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int tag_size;
  LogMessage local_70;
  int local_34;
  int local_30;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int result;
  int number_local;
  Extension *this_local;
  
  i_1 = 0;
  i = number;
  _result = this;
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      FVar1 = anon_unknown_0::real_type(this->type);
      iVar3 = WireFormatLite::TagSize(number,FVar1);
      i_1 = i_1 + iVar3;
      FVar1 = anon_unknown_0::real_type(this->type);
      switch(FVar1) {
      case TYPE_DOUBLE:
        i_1 = i_1 + 8;
        break;
      case TYPE_FLOAT:
        i_1 = i_1 + 4;
        break;
      case TYPE_INT64:
        iVar3 = WireFormatLite::Int64Size((this->field_0).int64_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_UINT64:
        iVar3 = WireFormatLite::UInt64Size((this->field_0).uint64_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_INT32:
        iVar3 = WireFormatLite::Int32Size((this->field_0).int32_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_FIXED64:
        i_1 = i_1 + 8;
        break;
      case TYPE_FIXED32:
        i_1 = i_1 + 4;
        break;
      case TYPE_BOOL:
        i_1 = i_1 + 1;
        break;
      case TYPE_STRING:
        iVar3 = WireFormatLite::StringSize((this->field_0).string_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_GROUP:
        iVar3 = WireFormatLite::GroupSize((this->field_0).message_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          iVar3 = WireFormatLite::MessageSize((this->field_0).message_value);
          i_1 = iVar3 + i_1;
        }
        else {
          uVar4 = (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x10))();
          iVar3 = io::CodedOutputStream::VarintSize32(uVar4);
          i_1 = iVar3 + uVar4 + i_1;
        }
        break;
      case TYPE_BYTES:
        iVar3 = WireFormatLite::BytesSize((this->field_0).string_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_UINT32:
        iVar3 = WireFormatLite::UInt32Size((this->field_0).uint32_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_ENUM:
        iVar3 = WireFormatLite::EnumSize((this->field_0).enum_value);
        i_1 = iVar3 + i_1;
        break;
      case TYPE_SFIXED32:
        i_1 = i_1 + 4;
        break;
      case TYPE_SFIXED64:
        i_1 = i_1 + 8;
        break;
      case TYPE_SINT32:
        iVar3 = WireFormatLite::SInt32Size((this->field_0).int32_value);
        i_1 = iVar3 + i_1;
        break;
      case MAX_FIELD_TYPE:
        iVar3 = WireFormatLite::SInt64Size((this->field_0).int64_value);
        i_1 = iVar3 + i_1;
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar1 = anon_unknown_0::real_type(this->type);
    iVar3 = WireFormatLite::TagSize(number,FVar1);
    FVar1 = anon_unknown_0::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar2 = RepeatedField<double>::size((this->field_0).repeated_double_value);
      i_1 = (iVar3 + 8) * iVar2 + i_1;
      break;
    case TYPE_FLOAT:
      iVar2 = RepeatedField<float>::size((this->field_0).repeated_float_value);
      i_1 = (iVar3 + 4) * iVar2 + i_1;
      break;
    case TYPE_INT64:
      iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_10 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          i_10 < iVar3; i_10 = i_10 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_10);
        iVar3 = WireFormatLite::Int64Size(*plVar8);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_UINT64:
      iVar2 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_12 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          i_12 < iVar3; i_12 = i_12 + 1) {
        puVar6 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_12);
        iVar3 = WireFormatLite::UInt64Size(*puVar6);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_INT32:
      iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_9 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_9 < iVar3; i_9 = i_9 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_9);
        iVar3 = WireFormatLite::Int32Size(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar2 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      i_1 = (iVar3 + 8) * iVar2 + i_1;
      break;
    case TYPE_FIXED32:
      iVar2 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      i_1 = (iVar3 + 4) * iVar2 + i_1;
      break;
    case TYPE_BOOL:
      iVar2 = RepeatedField<bool>::size((this->field_0).repeated_bool_value);
      i_1 = (iVar3 + 1) * iVar2 + i_1;
      break;
    case TYPE_STRING:
      iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((this->field_0).repeated_string_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_15 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), i_15 < iVar3; i_15 = i_15 + 1) {
        pbVar9 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Get((this->field_0).repeated_string_value,i_15);
        iVar3 = WireFormatLite::StringSize(pbVar9);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_GROUP:
      iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((this->field_0).repeated_message_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (size = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), size < iVar3; size = size + 1)
      {
        pMVar10 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,size);
        iVar3 = WireFormatLite::GroupSize(pMVar10);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_MESSAGE:
      iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((this->field_0).repeated_message_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (local_b0 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), local_b0 < iVar3;
          local_b0 = local_b0 + 1) {
        pMVar10 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_b0);
        iVar3 = WireFormatLite::MessageSize(pMVar10);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_BYTES:
      iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((this->field_0).repeated_string_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_16 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), i_16 < iVar3; i_16 = i_16 + 1) {
        pbVar9 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Get((this->field_0).repeated_string_value,i_16);
        iVar3 = WireFormatLite::BytesSize(pbVar9);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_UINT32:
      iVar2 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_11 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          i_11 < iVar3; i_11 = i_11 + 1) {
        puVar5 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_11);
        iVar3 = WireFormatLite::UInt32Size(*puVar5);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_ENUM:
      iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_17 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_17 < iVar3; i_17 = i_17 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_17);
        iVar3 = WireFormatLite::EnumSize(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      i_1 = (iVar3 + 4) * iVar2 + i_1;
      break;
    case TYPE_SFIXED64:
      iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      i_1 = (iVar3 + 8) * iVar2 + i_1;
      break;
    case TYPE_SINT32:
      iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_13 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_13 < iVar3; i_13 = i_13 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_13);
        iVar3 = WireFormatLite::SInt32Size(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      i_1 = iVar3 * iVar2 + i_1;
      for (i_14 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          i_14 < iVar3; i_14 = i_14 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_14);
        iVar3 = WireFormatLite::SInt64Size(*plVar8);
        i_1 = iVar3 + i_1;
      }
    }
  }
  else {
    FVar1 = anon_unknown_0::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value);
      i_1 = iVar3 * 8 + i_1;
      break;
    case TYPE_FLOAT:
      iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value);
      i_1 = iVar3 * 4 + i_1;
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar3 = i_3,
          iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar3 < iVar2;
          i_3 = i_3 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_3);
        iVar3 = WireFormatLite::Int64Size(*plVar8);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar3 = i_5,
          iVar2 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar3 < iVar2; i_5 = i_5 + 1) {
        puVar6 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_5);
        iVar3 = WireFormatLite::UInt64Size(*puVar6);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar3 = i_2,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          i_2 = i_2 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_2);
        iVar3 = WireFormatLite::Int32Size(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      i_1 = iVar3 * 8 + i_1;
      break;
    case TYPE_FIXED32:
      iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      i_1 = iVar3 * 4 + i_1;
      break;
    case TYPE_BOOL:
      iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value);
      i_1 = iVar3 + i_1;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x50d);
      other = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&i_7 + 3),other);
      LogMessage::~LogMessage(&local_70);
      break;
    case TYPE_UINT32:
      for (i_4 = 0; iVar3 = i_4,
          iVar2 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar3 < iVar2; i_4 = i_4 + 1) {
        puVar5 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_4);
        iVar3 = WireFormatLite::UInt32Size(*puVar5);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_ENUM:
      for (local_34 = 0; iVar3 = local_34,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          local_34 = local_34 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,local_34);
        iVar3 = WireFormatLite::EnumSize(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      i_1 = iVar3 * 4 + i_1;
      break;
    case TYPE_SFIXED64:
      iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      i_1 = iVar3 * 8 + i_1;
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar3 = i_6,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          i_6 = i_6 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_6);
        iVar3 = WireFormatLite::SInt32Size(*piVar7);
        i_1 = iVar3 + i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      for (local_30 = 0; iVar3 = local_30,
          iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar3 < iVar2;
          local_30 = local_30 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,local_30);
        iVar3 = WireFormatLite::SInt64Size(*plVar8);
        i_1 = iVar3 + i_1;
      }
    }
    this->cached_size = i_1;
    if (0 < i_1) {
      iVar3 = io::CodedOutputStream::VarintSize32(i_1);
      i_1 = iVar3 + i_1;
      uVar4 = WireFormatLite::MakeTag(i,WIRETYPE_LENGTH_DELIMITED);
      iVar3 = io::CodedOutputStream::VarintSize32(uVar4);
      i_1 = iVar3 + i_1;
    }
  }
  return i_1;
}

Assistant:

int ExtensionSet::Extension::ByteSize(int number) const {
  int result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += WireFormatLite::k##CAMELCASE##Size *                    \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = result;
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(
            WireFormatLite::MakeTag(number,
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      int tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += tag_size * repeated_##LOWERCASE##_value->size();        \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *       \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::CAMELCASE##Size(LOWERCASE);             \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          int size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)                                 \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::k##CAMELCASE##Size;                     \
        break
      HANDLE_TYPE( FIXED32,  Fixed32);
      HANDLE_TYPE( FIXED64,  Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(   FLOAT,    Float);
      HANDLE_TYPE(  DOUBLE,   Double);
      HANDLE_TYPE(    BOOL,     Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}